

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall InterCode::InterCode(InterCode *this,int k,Operand *t)

{
  this->kind = k;
  Operand::Operand(&this->target,t);
  (this->arg1).kind = 0;
  (this->arg1).value._M_dataplus._M_p = (pointer)&(this->arg1).value.field_2;
  (this->arg1).value._M_string_length = 0;
  (this->arg1).value.field_2._M_local_buf[0] = '\0';
  (this->arg1).active = -1;
  (this->arg2).kind = 0;
  (this->arg2).value._M_dataplus._M_p = (pointer)&(this->arg2).value.field_2;
  (this->arg2).value._M_string_length = 0;
  (this->arg2).value.field_2._M_local_buf[0] = '\0';
  (this->arg2).active = -1;
  return;
}

Assistant:

InterCode(int k, Operand t): kind(k), target(move(t)) {}